

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O1

bool __thiscall
cmFileCommand::HandleReadCommand
          (cmFileCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  pointer pbVar1;
  pointer pbVar2;
  pointer pcVar3;
  bool bVar4;
  int iVar5;
  _Ios_Seekdir _Var6;
  long *plVar7;
  offset_in_Arguments_to_bool member;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __begin0;
  pointer pbVar8;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __end0;
  long lVar9;
  string_view arg;
  static_string_view name;
  static_string_view name_00;
  static_string_view name_01;
  char c;
  string output;
  char hex [4];
  string fileName;
  Arguments arguments;
  ifstream file;
  bool local_2f1;
  cmCommand *local_2f0;
  string local_2e8;
  string local_2c8;
  undefined4 local_2a4;
  string local_2a0;
  char *local_280;
  long local_278;
  char local_270;
  undefined7 uStack_26f;
  char *local_260;
  long local_258;
  char local_250;
  undefined7 uStack_24f;
  char local_240;
  undefined1 local_238 [16];
  cmArgumentParser<Arguments> acStack_228 [21];
  
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_2f0 = &this->super_cmCommand;
  if ((ulong)((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1) < 0x41) {
    local_238._0_8_ = local_238 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_238,"READ must be called with at least two additional arguments","");
    cmCommand::SetError(local_2f0,(string *)local_238);
    if ((undefined1 *)local_238._0_8_ != local_238 + 0x10) {
      operator_delete((void *)local_238._0_8_,
                      (long)acStack_228[0].Bindings.
                            super_vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>_>_>
                            .
                            super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start + 1);
    }
    local_2a4._0_1_ = 0;
  }
  else {
    if ((HandleReadCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
         ::parser == '\0') &&
       (iVar5 = __cxa_guard_acquire(&HandleReadCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
                                     ::parser), iVar5 != 0)) {
      local_238._0_8_ = (pointer)0x0;
      local_238._8_8_ = (pointer)0x0;
      acStack_228[0].Bindings.
      super_vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>_>_>
      .
      super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      name.super_string_view._M_str = "OFFSET";
      name.super_string_view._M_len = 6;
      cmArgumentParser<cmFileCommand::HandleReadCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::Arguments>
      ::Bind<std::__cxx11::string>
                ((cmArgumentParser<cmFileCommand::HandleReadCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::Arguments>
                  *)local_238,name,0);
      member = 0x20;
      name_00.super_string_view._M_str = "LIMIT";
      name_00.super_string_view._M_len = 5;
      cmArgumentParser<cmFileCommand::HandleReadCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::Arguments>
      ::Bind<std::__cxx11::string>
                ((cmArgumentParser<cmFileCommand::HandleReadCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::Arguments>
                  *)local_238,name_00,0x20);
      name_01.super_string_view._M_str = "HEX";
      name_01.super_string_view._M_len = 3;
      cmArgumentParser<Arguments>::Bind<bool>
                ((cmArgumentParser<Arguments> *)local_238,name_01,member);
      std::
      vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>_>_>
      ::vector((vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>_>_>
                *)&HandleReadCommand::parser,
               (vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>_>_>
                *)local_238);
      std::
      vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>_>_>
      ::~vector((vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>_>_>
                 *)local_238);
      __cxa_atexit(cmArgumentParser<Arguments>::~cmArgumentParser,&HandleReadCommand::parser,
                   &__dso_handle);
      __cxa_guard_release(&HandleReadCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
                           ::parser);
    }
    pbVar2 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    pbVar8 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start + 3;
    local_280 = &local_270;
    local_278 = 0;
    local_270 = '\0';
    local_260 = &local_250;
    local_258 = 0;
    local_250 = '\0';
    local_240 = '\0';
    local_238._0_8_ = &HandleReadCommand::parser;
    local_238._8_8_ = (pointer)0x0;
    acStack_228[0].Bindings.
    super_vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>_>_>
    .
    super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    acStack_228[0].Bindings.
    super_vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>_>_>
    .
    super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish._0_1_ = '\0';
    if (pbVar8 != pbVar2) {
      do {
        arg._M_str = (pbVar8->_M_dataplus)._M_p;
        arg._M_len = pbVar8->_M_string_length;
        ArgumentParser::Instance::Consume
                  ((Instance *)local_238,arg,&local_280,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)0x0,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)0x0);
        pbVar8 = pbVar8 + 1;
      } while (pbVar8 != pbVar2);
    }
    local_2a0._M_dataplus._M_p = (pointer)&local_2a0.field_2;
    pcVar3 = pbVar1[1]._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_2a0,pcVar3,pcVar3 + pbVar1[1]._M_string_length);
    bVar4 = cmsys::SystemTools::FileIsFullPath(&local_2a0);
    if (!bVar4) {
      cmMakefile::GetCurrentSourceDirectory_abi_cxx11_(local_2f0->Makefile);
      std::__cxx11::string::_M_assign((string *)&local_2a0);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_238,
                     "/",pbVar1 + 1);
      std::__cxx11::string::_M_append((char *)&local_2a0,local_238._0_8_);
      if ((cmArgumentParser<Arguments> *)local_238._0_8_ !=
          (cmArgumentParser<Arguments> *)(local_238 + 0x10)) {
        operator_delete((void *)local_238._0_8_,
                        (long)acStack_228[0].Bindings.
                              super_vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>_>_>
                              .
                              super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start + 1);
      }
    }
    std::ifstream::ifstream(local_238,local_2a0._M_dataplus._M_p,_S_in);
    lVar9 = (long)(((cmArgumentParser<Arguments> *)(local_238._0_8_ + -0x18))->Bindings).
                  super_vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>_>_>
                  .
                  super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
    bVar4 = (*(byte *)((long)&acStack_228[0].Bindings.
                              super_vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>_>_>
                              .
                              super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>_>_>
                              ._M_impl + lVar9 + 0x10) & 5) == 0;
    local_2a4 = (undefined4)CONCAT71((int7)((ulong)lVar9 >> 8),bVar4);
    if (bVar4) {
      if (local_258 == 0) {
        lVar9 = -1;
      }
      else {
        iVar5 = atoi(local_260);
        lVar9 = (long)iVar5;
      }
      if (local_278 == 0) {
        _Var6 = _S_beg;
      }
      else {
        _Var6 = atoi(local_280);
      }
      std::istream::seekg((long)local_238,_Var6);
      local_2e8._M_dataplus._M_p = (pointer)&local_2e8.field_2;
      local_2e8._M_string_length = 0;
      local_2e8.field_2._M_local_buf[0] = '\0';
      if (local_240 == '\x01') {
        if (lVar9 != 0) {
          do {
            plVar7 = (long *)std::istream::get(local_238);
            if ((*(byte *)((long)plVar7 + *(long *)(*plVar7 + -0x18) + 0x20) & 5) != 0) break;
            sprintf((char *)&local_2c8,"%.2x",(ulong)local_2f1);
            std::__cxx11::string::append((char *)&local_2e8);
            lVar9 = lVar9 - (ulong)(0 < lVar9);
          } while (lVar9 != 0);
        }
      }
      else {
        local_2c8._M_dataplus._M_p = (pointer)&local_2c8.field_2;
        local_2c8._M_string_length = 0;
        local_2c8.field_2._M_local_buf[0] = '\0';
        local_2f1 = false;
        if (lVar9 != 0) {
          do {
            bVar4 = cmsys::SystemTools::GetLineFromStream
                              ((istream *)local_238,&local_2c8,&local_2f1,lVar9);
            if (!bVar4) break;
            if ((0 < lVar9) && (lVar9 = lVar9 - (local_2f1 + local_2c8._M_string_length), lVar9 < 1)
               ) {
              lVar9 = 0;
            }
            std::__cxx11::string::_M_append((char *)&local_2e8,(ulong)local_2c8._M_dataplus._M_p);
            if (local_2f1 == true) {
              std::__cxx11::string::append((char *)&local_2e8);
            }
          } while (lVar9 != 0);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
          operator_delete(local_2c8._M_dataplus._M_p,
                          CONCAT71(local_2c8.field_2._M_allocated_capacity._1_7_,
                                   local_2c8.field_2._M_local_buf[0]) + 1);
        }
      }
      cmMakefile::AddDefinition(local_2f0->Makefile,pbVar1 + 2,local_2e8._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
        operator_delete(local_2e8._M_dataplus._M_p,
                        CONCAT71(local_2e8.field_2._M_allocated_capacity._1_7_,
                                 local_2e8.field_2._M_local_buf[0]) + 1);
      }
    }
    else {
      local_2e8._M_dataplus._M_p = (pointer)&local_2e8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_2e8,"failed to open for reading (","");
      cmsys::SystemTools::GetLastSystemError_abi_cxx11_();
      std::__cxx11::string::_M_append((char *)&local_2e8,(ulong)local_2c8._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
        operator_delete(local_2c8._M_dataplus._M_p,
                        CONCAT71(local_2c8.field_2._M_allocated_capacity._1_7_,
                                 local_2c8.field_2._M_local_buf[0]) + 1);
      }
      std::__cxx11::string::append((char *)&local_2e8);
      std::__cxx11::string::_M_append((char *)&local_2e8,(ulong)local_2a0._M_dataplus._M_p);
      cmCommand::SetError(local_2f0,&local_2e8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
        operator_delete(local_2e8._M_dataplus._M_p,
                        CONCAT71(local_2e8.field_2._M_allocated_capacity._1_7_,
                                 local_2e8.field_2._M_local_buf[0]) + 1);
      }
    }
    std::ifstream::~ifstream(local_238);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
      operator_delete(local_2a0._M_dataplus._M_p,local_2a0.field_2._M_allocated_capacity + 1);
    }
    if (local_260 != &local_250) {
      operator_delete(local_260,CONCAT71(uStack_24f,local_250) + 1);
    }
    if (local_280 != &local_270) {
      operator_delete(local_280,CONCAT71(uStack_26f,local_270) + 1);
    }
  }
  return (bool)(undefined1)local_2a4;
}

Assistant:

bool cmFileCommand::HandleReadCommand(std::vector<std::string> const& args)
{
  if (args.size() < 3) {
    this->SetError("READ must be called with at least two additional "
                   "arguments");
    return false;
  }

  std::string const& fileNameArg = args[1];
  std::string const& variable = args[2];

  struct Arguments
  {
    std::string Offset;
    std::string Limit;
    bool Hex = false;
  };

  static auto const parser = cmArgumentParser<Arguments>{}
                               .Bind("OFFSET"_s, &Arguments::Offset)
                               .Bind("LIMIT"_s, &Arguments::Limit)
                               .Bind("HEX"_s, &Arguments::Hex);

  Arguments const arguments = parser.Parse(cmMakeRange(args).advance(3));

  std::string fileName = fileNameArg;
  if (!cmsys::SystemTools::FileIsFullPath(fileName)) {
    fileName = this->Makefile->GetCurrentSourceDirectory();
    fileName += "/" + fileNameArg;
  }

// Open the specified file.
#if defined(_WIN32) || defined(__CYGWIN__)
  cmsys::ifstream file(fileName.c_str(),
                       arguments.Hex ? (std::ios::binary | std::ios::in)
                                     : std::ios::in);
#else
  cmsys::ifstream file(fileName.c_str());
#endif

  if (!file) {
    std::string error = "failed to open for reading (";
    error += cmSystemTools::GetLastSystemError();
    error += "):\n  ";
    error += fileName;
    this->SetError(error);
    return false;
  }

  // is there a limit?
  long sizeLimit = -1;
  if (!arguments.Limit.empty()) {
    sizeLimit = atoi(arguments.Limit.c_str());
  }

  // is there an offset?
  long offset = 0;
  if (!arguments.Offset.empty()) {
    offset = atoi(arguments.Offset.c_str());
  }

  file.seekg(offset, std::ios::beg); // explicit ios::beg for IBM VisualAge 6

  std::string output;

  if (arguments.Hex) {
    // Convert part of the file into hex code
    char c;
    while ((sizeLimit != 0) && (file.get(c))) {
      char hex[4];
      sprintf(hex, "%.2x", c & 0xff);
      output += hex;
      if (sizeLimit > 0) {
        sizeLimit--;
      }
    }
  } else {
    std::string line;
    bool has_newline = false;
    while (
      sizeLimit != 0 &&
      cmSystemTools::GetLineFromStream(file, line, &has_newline, sizeLimit)) {
      if (sizeLimit > 0) {
        sizeLimit = sizeLimit - static_cast<long>(line.size());
        if (has_newline) {
          sizeLimit--;
        }
        if (sizeLimit < 0) {
          sizeLimit = 0;
        }
      }
      output += line;
      if (has_newline) {
        output += "\n";
      }
    }
  }
  this->Makefile->AddDefinition(variable, output.c_str());
  return true;
}